

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O2

bool __thiscall
CCNR::ls_solver::local_search(ls_solver *this,vector<char,_std::allocator<char>_> *init_solution)

{
  int *piVar1;
  int *piVar2;
  int flipv;
  size_t k;
  int *piVar3;
  pointer piVar4;
  long lVar5;
  pointer piVar6;
  ulong uVar7;
  bool bVar8;
  allocator_type local_3d;
  value_type_conflict1 local_3c;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  Mersenne::seed(&this->_random_gen,this->_random_seed);
  this->_best_found_cost = this->_num_clauses;
  this->_best_cost_time = 0.0;
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_38,this->_num_vars + 10,&local_3c,&local_3d
            );
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->conflict_ct,&local_38);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  initialize(this,init_solution);
  piVar4 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar6 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->_init_unsat_nums = (int)((ulong)((long)piVar4 - (long)piVar6) >> 2);
  bVar8 = true;
  if (piVar4 != piVar6) {
    lVar5 = 0;
    while ((this->_step = lVar5, lVar5 < this->_max_steps && (this->_mems <= this->_max_mems))) {
      flipv = pick_var(this);
      flip(this,flipv);
      piVar2 = (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar4 = (this->conflict_ct).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (piVar3 = (this->_unsat_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar3 != piVar2; piVar3 = piVar3 + 1) {
        piVar1 = piVar4 + *piVar3;
        *piVar1 = *piVar1 + 1;
      }
      piVar4 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar7 = (long)piVar6 - (long)piVar4 >> 2;
      if (uVar7 < this->_best_found_cost) {
        this->_best_found_cost = uVar7;
        for (uVar7 = 0; uVar7 < this->_num_vars + 1; uVar7 = uVar7 + 1) {
          (this->_best_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] =
               (this->_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
        }
        piVar4 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      if (piVar6 == piVar4) {
        return true;
      }
      lVar5 = this->_step + 1;
    }
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool ls_solver::local_search(const vector<char> *init_solution)
{
    bool result = false;
    int flipv;
    _random_gen.seed(_random_seed);
    _best_found_cost = _num_clauses;
    _best_cost_time = 0;
    conflict_ct = vector<int>(_num_vars + 10, 0);
    // for(int t=0; t < _max_tries; t++)
    // {
    initialize(init_solution);
    // cout<<"start ls"<<endl;
    _init_unsat_nums = _unsat_clauses.size();
    if (0 == _unsat_clauses.size()) {
        return true;
    } // 1
    for (_step = 0; _step < _max_steps; _step++) {
        if (_mems > _max_mems) {
            // std::cout << "c local search timeout with step "<< _step<< std::endl;
            return result;
        }
        flipv = pick_var();
        flip(flipv);
        for (int var_idx : _unsat_vars) ++conflict_ct[var_idx];
        if (_unsat_clauses.size() < _best_found_cost) {
            _best_found_cost = _unsat_clauses.size();
            for (size_t k = 0; k < _num_vars + 1; ++k) {
                _best_solution[k] = _solution[k];
            }
            // _best_cost_time = get_runtime();
        }
        if (0 == _unsat_clauses.size()) {
            result = true;
            break;
        } // 1
        // if (get_runtime() > _time_limit) {result = false;break;} //0
    }
    // if (0 == _unsat_clauses.size()) {result = true;}//1
    // if (get_runtime() > _time_limit) {result = false;break;}//0
    // }
    // _end_step = _step;
    return result;
}